

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O1

AST * __thiscall
jsonnet::internal::Desugarer::makeObject(Desugarer *this,Object *ast,uint obj_level)

{
  pointer pOVar1;
  sockaddr *__addr;
  _List_node_base *p_Var2;
  DesugaredObject *pDVar3;
  Identifier *id;
  AST *body;
  _List_node_base *p_Var4;
  long *plVar5;
  Self *pSVar6;
  LocationRange *args;
  pointer ppVar7;
  ObjectField *field;
  pointer pOVar8;
  AST *retval;
  Fields new_fields;
  ASTs new_asserts;
  SuperVars svs;
  Binds binds;
  DesugaredObject *local_1c8;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *local_1c0;
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  local_1b8;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> local_198;
  SuperVars local_180;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> local_168;
  undefined1 local_150 [32];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_130;
  undefined1 local_118 [24];
  undefined1 local_100 [48];
  undefined1 local_d0 [24];
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_b8;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_90;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_70;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_48;
  
  if (obj_level == 0) {
    local_150._0_8_ = local_150 + 0x10;
    ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)local_150,L"$",L"");
    id = Allocator::makeIdentifier(this->alloc,(UString *)local_150);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ * 4 + 4);
    }
    body = &Allocator::
            make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                      (this->alloc,(LocationRange *)E,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF)->super_AST;
    ObjectField::Local((ObjectField *)local_150,(Fodder *)EF,(Fodder *)EF,id,(Fodder *)EF,body,
                       (Fodder *)EF);
    ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
    emplace_back<jsonnet::internal::ObjectField>(&ast->fields,(ObjectField *)local_150);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(&local_48);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(&local_70);
    ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
    ~vector(&local_90);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)local_100);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)local_118);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(&local_130);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)(local_150 + 8));
  }
  desugarFields(&local_180,this,&ast->super_AST,&ast->fields,obj_level);
  local_1b8.
  super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.
  super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_198;
  local_198.super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
  _M_impl._M_node._M_size = 0;
  pOVar1 = (ast->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_198.super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       local_198.
       super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl
       ._M_node.super__List_node_base._M_next;
  for (pOVar8 = (ast->fields).
                super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar8 != pOVar1; pOVar8 = pOVar8 + 1) {
    if (pOVar8->kind == FIELD_EXPR) {
      ::std::
      vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
      ::
      emplace_back<jsonnet::internal::ObjectField::Hide_const&,jsonnet::internal::AST*const&,jsonnet::internal::AST*const&>
                ((vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
                  *)&local_1b8,&pOVar8->hide,&pOVar8->expr1,&pOVar8->expr2);
    }
    else if (pOVar8->kind == ASSERT) {
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = (_List_node_base *)pOVar8->expr2;
      ::std::__detail::_List_node_base::_M_hook(p_Var4);
      local_198.
      super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>._M_impl.
      _M_node._M_size =
           local_198.
           super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
           _M_impl._M_node._M_size + 1;
    }
    else {
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&::std::cerr,"INTERNAL ERROR: field should have been desugared: ",0x32);
      plVar5 = (long *)::std::ostream::operator<<(&::std::cerr,pOVar8->kind);
      ::std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      ::std::ostream::put((char)plVar5);
      ::std::ostream::flush();
    }
  }
  args = &(ast->super_AST).location;
  local_1c8 = Allocator::
              make<jsonnet::internal::DesugaredObject,jsonnet::internal::LocationRange&,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>&,std::vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>&>
                        (this->alloc,args,&local_198,&local_1b8);
  if (local_180.
      super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_180.
      super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_168.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c0 = &local_b8;
    ppVar7 = local_180.
             super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppVar7->second == (AST *)0x0) {
        __addr = (sockaddr *)ppVar7->first;
        pSVar6 = Allocator::
                 make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                           (this->alloc,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF);
        bind((Desugarer *)local_150,(int)this,__addr,(socklen_t)pSVar6);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        emplace_back<jsonnet::internal::Local::Bind>(&local_168,(Bind *)local_150);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(local_1c0);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)local_d0);
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )(local_100 + 0x10));
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)(local_118 + 0x10));
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_130);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)local_150);
      }
      else {
        bind((Desugarer *)local_150,(int)this,(sockaddr *)ppVar7->first,(socklen_t)ppVar7->second);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        emplace_back<jsonnet::internal::Local::Bind>(&local_168,(Bind *)local_150);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(local_1c0);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)local_d0);
        ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
        ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *
                )(local_100 + 0x10));
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)(local_118 + 0x10));
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector(&local_130);
        ::std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)local_150);
      }
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != local_180.
                       super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    local_1c8 = (DesugaredObject *)
                Allocator::
                make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                          (this->alloc,args,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&local_168,(AST **)&local_1c8);
    ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector(&local_168);
  }
  pDVar3 = local_1c8;
  p_Var4 = local_198.
           super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&local_198) {
    p_Var2 = (((_List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var4,0x18);
    p_Var4 = p_Var2;
  }
  if (local_1b8.
      super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b8.
                          super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.
                          super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_180.
      super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.
                    super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super__Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return &pDVar3->super_AST;
}

Assistant:

AST* makeObject(Object *ast, unsigned obj_level) {
        // Hidden variable to allow outer/top binding.
        if (obj_level == 0) {
            const Identifier *hidden_var = id(U"$");
            auto *body = make<Self>(E, EF);
            ast->fields.push_back(ObjectField::Local(EF, EF, hidden_var, EF, body, EF));
        }

        SuperVars svs = desugarFields(ast, ast->fields, obj_level);

        DesugaredObject::Fields new_fields;
        ASTs new_asserts;
        for (const ObjectField &field : ast->fields) {
            if (field.kind == ObjectField::ASSERT) {
                new_asserts.push_back(field.expr2);
            } else if (field.kind == ObjectField::FIELD_EXPR) {
                new_fields.emplace_back(field.hide, field.expr1, field.expr2);
            } else {
                std::cerr << "INTERNAL ERROR: field should have been desugared: " << field.kind
                          << std::endl;
            }
        }

        AST* retval = make<DesugaredObject>(ast->location, new_asserts, new_fields);
        if (svs.size() > 0) {
            Local::Binds binds;
            for (const auto &pair : svs) {
                if (pair.second == nullptr) {
                    // Self binding
                    binds.push_back(bind(pair.first, make<Self>(E, EF)));
                } else {
                    // Super binding
                    binds.push_back(bind(pair.first, pair.second));
                }
            }
            retval = make<Local>(ast->location, EF, binds, retval);
        }

        return retval;
    }